

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<float>::VerifySymmetry(TPZMatrix<float> *this,REAL tol)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  uVar2 = 0;
  if (lVar1 == (this->super_TPZBaseMatrix).fCol) {
    lVar4 = 0;
    lVar6 = 0;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    lVar5 = 1;
    for (; lVar4 != lVar6; lVar4 = lVar4 + 1) {
      for (lVar7 = 0; lVar5 != lVar7; lVar7 = lVar7 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar4,lVar7);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar7,lVar4);
        if (tol < (double)ABS(extraout_XMM0_Da - extraout_XMM0_Da_00)) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Elemento: ");
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,", ");
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          poVar3 = std::operator<<(poVar3,"  -> ");
          poVar3 = (ostream *)
                   std::ostream::operator<<(poVar3,extraout_XMM0_Da - extraout_XMM0_Da_00);
          poVar3 = std::operator<<(poVar3,"/");
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar4,lVar7);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,extraout_XMM0_Da_01);
          std::endl<char,std::char_traits<char>>(poVar3);
          goto LAB_00d13090;
        }
      }
      lVar5 = lVar5 + 1;
    }
LAB_00d13090:
    uVar2 = (uint)(lVar1 <= lVar4);
  }
  return uVar2;
}

Assistant:

int TPZMatrix<TVar>::VerifySymmetry(REAL tol) const{
	int64_t nrows = this->Rows();
	int64_t ncols = this->Cols();
	if (nrows != ncols) return 0;
	
	for( int64_t i = 0; i < nrows; i++){
		for(int64_t j = 0; j <= i; j++){
            TVar exp = this->Get(i,j) - this->Get(j,i);
			if ( (REAL)(fabs( exp )) > tol ) {
			  	#ifdef STATE_COMPLEX
				cout << "Elemento: " << i << ", " << j << "  -> " << fabs( exp ) << "/" <<
				this->Get(i,j) << endl;
				#else
				cout << "Elemento: " << i << ", " << j << "  -> " << exp << "/" <<
				this->Get(i,j) << endl;
				#endif
				return 0;
			}
		}
	}
	return 1;
}